

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::CopyPropagateArrays::CanUpdateUses
          (CopyPropagateArrays *this,Instruction *original_ptr_inst,uint32_t type_id)

{
  bool bVar1;
  int iVar2;
  TypeManager *this_00;
  ConstantManager *pCVar3;
  DefUseManager *this_01;
  Type *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = IRContext::get_type_mgr((this->super_MemPass).super_Pass.context_);
  pCVar3 = IRContext::get_constant_mgr((this->super_MemPass).super_Pass.context_);
  this_01 = IRContext::get_def_use_mgr((this->super_MemPass).super_Pass.context_);
  pTVar4 = analysis::TypeManager::GetType(this_00,type_id);
  iVar2 = (*pTVar4->_vptr_Type[0x19])(pTVar4);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    iVar2 = (*pTVar4->_vptr_Type[0x1b])(pTVar4);
    if (((CONCAT44(extraout_var_00,iVar2) == 0) &&
        (iVar2 = (*pTVar4->_vptr_Type[0x17])(pTVar4), CONCAT44(extraout_var_01,iVar2) == 0)) &&
       (iVar2 = (*pTVar4->_vptr_Type[0x1f])(pTVar4), CONCAT44(extraout_var_02,iVar2) == 0)) {
      return true;
    }
    local_50._8_8_ = 0;
    local_50._M_unused._M_object = operator_new(0x20);
    *(CopyPropagateArrays **)local_50._M_unused._0_8_ = this;
    *(TypeManager **)((long)local_50._M_unused._0_8_ + 8) = this_00;
    *(ConstantManager **)((long)local_50._M_unused._0_8_ + 0x10) = pCVar3;
    *(Type **)((long)local_50._M_unused._0_8_ + 0x18) = pTVar4;
    local_38 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/copy_prop_arrays.cpp:509:55)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/copy_prop_arrays.cpp:509:55)>
               ::_M_manager;
    bVar1 = analysis::DefUseManager::WhileEachUse
                      (this_01,original_ptr_inst,
                       (function<bool_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CopyPropagateArrays::CanUpdateUses(Instruction* original_ptr_inst,
                                        uint32_t type_id) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  analysis::Type* type = type_mgr->GetType(type_id);
  if (type->AsRuntimeArray()) {
    return false;
  }

  if (!type->AsStruct() && !type->AsArray() && !type->AsPointer()) {
    // If the type is not an aggregate, then the desired type must be the
    // same as the current type.  No work to do, and we can do that.
    return true;
  }

  return def_use_mgr->WhileEachUse(original_ptr_inst, [this, type_mgr,
                                                       const_mgr,
                                                       type](Instruction* use,
                                                             uint32_t) {
    if (IsDebugDeclareOrValue(use)) return true;

    switch (use->opcode()) {
      case spv::Op::OpLoad: {
        analysis::Pointer* pointer_type = type->AsPointer();
        uint32_t new_type_id = type_mgr->GetId(pointer_type->pointee_type());

        if (new_type_id != use->type_id()) {
          return CanUpdateUses(use, new_type_id);
        }
        return true;
      }
      case spv::Op::OpAccessChain: {
        analysis::Pointer* pointer_type = type->AsPointer();
        const analysis::Type* pointee_type = pointer_type->pointee_type();

        std::vector<uint32_t> access_chain;
        for (uint32_t i = 1; i < use->NumInOperands(); ++i) {
          const analysis::Constant* index_const =
              const_mgr->FindDeclaredConstant(use->GetSingleWordInOperand(i));
          if (index_const) {
            access_chain.push_back(index_const->GetU32());
          } else {
            // Variable index means the type is a type where every element
            // is the same type.  Use element 0 to get the type.
            access_chain.push_back(0);

            // We are trying to access a struct with variable indices.
            // This cannot happen.
            if (pointee_type->kind() == analysis::Type::kStruct) {
              return false;
            }
          }
        }

        const analysis::Type* new_pointee_type =
            type_mgr->GetMemberType(pointee_type, access_chain);
        analysis::Pointer pointerTy(new_pointee_type,
                                    pointer_type->storage_class());
        uint32_t new_pointer_type_id =
            context()->get_type_mgr()->GetTypeInstruction(&pointerTy);
        if (new_pointer_type_id == 0) {
          return false;
        }

        if (new_pointer_type_id != use->type_id()) {
          return CanUpdateUses(use, new_pointer_type_id);
        }
        return true;
      }
      case spv::Op::OpCompositeExtract: {
        std::vector<uint32_t> access_chain;
        for (uint32_t i = 1; i < use->NumInOperands(); ++i) {
          access_chain.push_back(use->GetSingleWordInOperand(i));
        }

        const analysis::Type* new_type =
            type_mgr->GetMemberType(type, access_chain);
        uint32_t new_type_id = type_mgr->GetTypeInstruction(new_type);
        if (new_type_id == 0) {
          return false;
        }

        if (new_type_id != use->type_id()) {
          return CanUpdateUses(use, new_type_id);
        }
        return true;
      }
      case spv::Op::OpStore:
        // If needed, we can create an element-by-element copy to change the
        // type of the value being stored.  This way we can always handled
        // stores.
        return true;
      case spv::Op::OpImageTexelPointer:
      case spv::Op::OpName:
        return true;
      default:
        return use->IsDecoration();
    }
  });
}